

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierParser::AddToken(CQualifierParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  CQualifierParser *local_10;
  CQualifierParser *this_local;
  
  local_10 = this;
  bVar1 = CParsingElementState::IsFinished(&this->super_CParsingElementState);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    switch((this->token).type) {
    case TT_Word:
      addWord(this);
      break;
    case TT_Blank:
      break;
    case TT_Comma:
    case TT_Equal:
    case TT_LeftBracket:
    case TT_RightBracket:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"unexpected token in qualifier",&local_31);
      error(this,(string *)local_30);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      break;
    case TT_Label:
      addLabel(this);
      break;
    case TT_Number:
      addNumber(this);
      break;
    case TT_String:
      addString(this);
      break;
    case TT_LineFeed:
      addLineFeed(this);
      break;
    case TT_Qualifier:
      addQualifier(this);
      break;
    case TT_LeftParen:
      addLeftParen(this);
      break;
    case TT_RightParen:
      addRightParen(this);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/QualifierParser.cpp"
                    ,0x45,"void Refal2::CQualifierParser::AddToken()");
    }
    return;
  }
  __assert_fail("!IsFinished()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/QualifierParser.cpp"
                ,0x22,"void Refal2::CQualifierParser::AddToken()");
}

Assistant:

void CQualifierParser::AddToken()
{
	assert( !IsFinished() );
	switch( token.type ) {
		case TT_Blank:
			break;
		case TT_Word:
			addWord();
			break;
		case TT_Label:
			addLabel();
			break;
		case TT_Number:
			addNumber();
			break;
		case TT_String:
			addString();
			break;
		case TT_LineFeed:
			addLineFeed();
			break;
		case TT_Qualifier:
			addQualifier();
			break;
		case TT_LeftParen:
			addLeftParen();
			break;
		case TT_RightParen:
			addRightParen();
			break;
		case TT_Comma:
		case TT_Equal:
		case TT_LeftBracket:
		case TT_RightBracket:
			error( "unexpected token in qualifier" );
			break;
		default:
			assert( false );
			break;
	}
}